

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O1

bool printSymbolizedStackTrace(StringRef Argv0,void **StackTrace,int Depth,raw_ostream *OS)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  string *MainAddr;
  ulong in_R9;
  StringRef Str;
  StringRef path;
  StringRef Name;
  ArrayRef<llvm::StringRef> Paths;
  StringRef Parent;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LLVMSymbolizerPathOrErr;
  vector<long,_std::allocator<long>_> Offsets;
  vector<const_char_*,_std::allocator<const_char_*>_> Modules;
  BumpPtrAllocator Allocator;
  allocator_type local_119;
  StringRef local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  StringRef local_f8;
  value_type_conflict5 local_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  long local_d0 [2];
  byte local_c0;
  vector<long,_std::allocator<long>_> local_b8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a0;
  anon_union_32_2_427f0595_for_ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_88;
  byte local_68 [32];
  size_t *local_48;
  undefined8 local_40;
  size_t asStack_38 [4];
  
  local_f8.Length = Argv0.Length;
  local_f8.Data = Argv0.Data;
  MainAddr = (string *)0x0;
  Str.Length = 0xf;
  Str.Data = "llvm-symbolizer";
  sVar2 = llvm::StringRef::find(&local_f8,Str,0);
  if (sVar2 == 0xffffffffffffffff) {
    local_d8 = std::_V2::system_category();
    local_c0 = local_c0 | 1;
    local_e0 = 0;
    if ((char *)local_f8.Length != (char *)0x0) {
      path.Length = 2;
      path.Data = (char *)local_f8.Length;
      local_118 = llvm::sys::path::parent_path((path *)local_f8.Data,path,(Style)MainAddr);
      if (local_118.Length != 0) {
        MainAddr = (string *)&local_118;
        Name.Length = (size_t)MainAddr;
        Name.Data = (char *)0xf;
        Paths.Length = in_R9;
        Paths.Data = (StringRef *)0x1;
        llvm::sys::findProgramByName_abi_cxx11_
                  ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88.TStorage,(sys *)"llvm-symbolizer",Name,Paths);
        llvm::ErrorOr<std::__cxx11::string>::moveAssign<std::__cxx11::string>
                  ((ErrorOr<std::__cxx11::string> *)&local_e0,
                   (ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88.TStorage);
        if (((local_68[0] & 1) == 0) &&
           ((char *)local_88._0_8_ !=
            local_88.TStorage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
        }
      }
    }
    if ((local_c0 & 1) != 0) {
      MainAddr = (string *)0x0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_R9;
      llvm::sys::findProgramByName_abi_cxx11_
                ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88.TStorage,(sys *)"llvm-symbolizer",(StringRef)ZEXT816(0xf),
                 (ArrayRef<llvm::StringRef>)(auVar1 << 0x40));
      llvm::ErrorOr<std::__cxx11::string>::moveAssign<std::__cxx11::string>
                ((ErrorOr<std::__cxx11::string> *)&local_e0,
                 (ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88.TStorage);
      if (((local_68[0] & 1) == 0) &&
         ((char *)local_88._0_8_ !=
          local_88.TStorage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
    }
    if ((local_c0 & 1) == 0) {
      if ((char *)local_f8.Length == (char *)0x0) {
        llvm::sys::fs::getMainExecutable_abi_cxx11_
                  ((string *)&local_118,(fs *)0x0,(char *)0x0,MainAddr);
      }
      else {
        local_118.Data = (char *)&local_108;
        if ((path *)local_f8.Data == (path *)0x0) {
          local_118.Length = 0;
          local_108._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,local_f8.Data,
                     (char *)(local_f8.Length + (long)local_f8.Data));
        }
      }
      local_88._16_8_ = local_68;
      local_88._0_8_ = (undefined1 *)0x0;
      local_88._8_8_ = 0;
      local_88._24_8_ = 0x400000000;
      local_48 = asStack_38;
      local_40 = 0;
      asStack_38[0] = 0;
      asStack_38[1] = 1;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_a0,(long)Depth,(value_type *)&local_b8,(allocator_type *)&local_e8);
      local_e8 = 0;
      std::vector<long,_std::allocator<long>_>::vector(&local_b8,(long)Depth,&local_e8,&local_119);
      if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
                ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&local_88.TStorage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.Data != &local_108) {
        operator_delete(local_118.Data,
                        CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) +
                        1);
      }
    }
    if (((local_c0 & 1) == 0) && ((long *)CONCAT44(uStack_dc,local_e0) != local_d0)) {
      operator_delete((long *)CONCAT44(uStack_dc,local_e0),local_d0[0] + 1);
    }
  }
  return false;
}

Assistant:

LLVM_ATTRIBUTE_USED
static bool printSymbolizedStackTrace(StringRef Argv0, void **StackTrace,
                                      int Depth, llvm::raw_ostream &OS) {
  if (DisableSymbolicationFlag)
    return false;

  // Don't recursively invoke the llvm-symbolizer binary.
  if (Argv0.find("llvm-symbolizer") != std::string::npos)
    return false;

  // FIXME: Subtract necessary number from StackTrace entries to turn return addresses
  // into actual instruction addresses.
  // Use llvm-symbolizer tool to symbolize the stack traces. First look for it
  // alongside our binary, then in $PATH.
  ErrorOr<std::string> LLVMSymbolizerPathOrErr = std::error_code();
  if (!Argv0.empty()) {
    StringRef Parent = llvm::sys::path::parent_path(Argv0);
    if (!Parent.empty())
      LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer", Parent);
  }
  if (!LLVMSymbolizerPathOrErr)
    LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer");
  if (!LLVMSymbolizerPathOrErr)
    return false;
  const std::string &LLVMSymbolizerPath = *LLVMSymbolizerPathOrErr;

  // If we don't know argv0 or the address of main() at this point, try
  // to guess it anyway (it's possible on some platforms).
  std::string MainExecutableName =
      Argv0.empty() ? sys::fs::getMainExecutable(nullptr, nullptr)
                    : (std::string)Argv0;
  BumpPtrAllocator Allocator;
  StringSaver StrPool(Allocator);
  std::vector<const char *> Modules(Depth, nullptr);
  std::vector<intptr_t> Offsets(Depth, 0);
  if (!findModulesAndOffsets(StackTrace, Depth, Modules.data(), Offsets.data(),
                             MainExecutableName.c_str(), StrPool))
    return false;
  int InputFD;
  SmallString<32> InputFile, OutputFile;
  sys::fs::createTemporaryFile("symbolizer-input", "", InputFD, InputFile);
  sys::fs::createTemporaryFile("symbolizer-output", "", OutputFile);
  FileRemover InputRemover(InputFile.c_str());
  FileRemover OutputRemover(OutputFile.c_str());

  {
    raw_fd_ostream Input(InputFD, true);
    for (int i = 0; i < Depth; i++) {
      if (Modules[i])
        Input << Modules[i] << " " << (void*)Offsets[i] << "\n";
    }
  }

  Optional<StringRef> Redirects[] = {StringRef(InputFile),
                                     StringRef(OutputFile), llvm::None};
  StringRef Args[] = {"llvm-symbolizer", "--functions=linkage", "--inlining",
#ifdef _WIN32
                      // Pass --relative-address on Windows so that we don't
                      // have to add ImageBase from PE file.
                      // FIXME: Make this the default for llvm-symbolizer.
                      "--relative-address",
#endif
                      "--demangle"};
  int RunResult =
      sys::ExecuteAndWait(LLVMSymbolizerPath, Args, None, Redirects);
  if (RunResult != 0)
    return false;

  // This report format is based on the sanitizer stack trace printer.  See
  // sanitizer_stacktrace_printer.cc in compiler-rt.
  auto OutputBuf = MemoryBuffer::getFile(OutputFile.c_str());
  if (!OutputBuf)
    return false;
  StringRef Output = OutputBuf.get()->getBuffer();
  SmallVector<StringRef, 32> Lines;
  Output.split(Lines, "\n");
  auto CurLine = Lines.begin();
  int frame_no = 0;
  for (int i = 0; i < Depth; i++) {
    if (!Modules[i]) {
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << '\n';
      continue;
    }
    // Read pairs of lines (function name and file/line info) until we
    // encounter empty line.
    for (;;) {
      if (CurLine == Lines.end())
        return false;
      StringRef FunctionName = *CurLine++;
      if (FunctionName.empty())
        break;
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << ' ';
      if (!FunctionName.startswith("??"))
        OS << FunctionName << ' ';
      if (CurLine == Lines.end())
        return false;
      StringRef FileLineInfo = *CurLine++;
      if (!FileLineInfo.startswith("??"))
        OS << FileLineInfo;
      else
        OS << "(" << Modules[i] << '+' << format_hex(Offsets[i], 0) << ")";
      OS << "\n";
    }
  }
  return true;
}